

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeJacobian
          (ChElementHexaCorot_8 *this,ChMatrixDynamic<> *Jacobian,ChMatrixDynamic<> *J1,
          ChVector<double> *coord)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  LhsNested pMVar4;
  RhsNested pMVar5;
  Scalar SVar6;
  Scalar *pSVar7;
  undefined1 auVar8 [16];
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_70;
  Scalar local_60;
  ChMatrixDynamic<> J2;
  int local_3c;
  undefined1 local_38 [16];
  
  local_70.m_lhs._0_4_ = 8;
  local_3c = 3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&J2,(int *)&local_70,&local_3c);
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0);
  *pSVar7 = (1.0 - dVar2) * (1.0 - dVar1) * -0.125;
  auVar3 = *(undefined1 (*) [16])(coord->m_data + 1);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,1);
  local_38._8_8_ = 0x3ff0000000000000;
  local_38._0_8_ = 0x3ff0000000000000;
  auVar8 = vsubpd_avx(local_38,auVar3);
  auVar3 = vshufpd_avx(auVar8,auVar8,1);
  *pSVar7 = auVar8._0_8_ * auVar3._0_8_ * 0.125;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,2);
  *pSVar7 = (dVar1 + 1.0) * (1.0 - dVar2) * 0.125;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,3);
  *pSVar7 = (1.0 - dVar2) * (dVar1 + 1.0) * -0.125;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,4);
  *pSVar7 = (dVar2 + 1.0) * (1.0 - dVar1) * -0.125;
  dVar1 = coord->m_data[1];
  auVar3 = *(undefined1 (*) [16])(coord->m_data + 1);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,5);
  auVar3 = vshufpd_avx(auVar3,auVar3,1);
  *pSVar7 = (1.0 - dVar1) * (auVar3._0_8_ + 1.0) * 0.125;
  auVar8 = *(undefined1 (*) [16])(coord->m_data + 1);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,6);
  auVar3._8_8_ = 0x3ff0000000000000;
  auVar3._0_8_ = 0x3ff0000000000000;
  auVar8 = vaddpd_avx512vl(auVar8,auVar3);
  auVar3 = vshufpd_avx(auVar8,auVar8,1);
  *pSVar7 = auVar8._0_8_ * auVar3._0_8_ * 0.125;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,7);
  *pSVar7 = (dVar2 + 1.0) * (dVar1 + 1.0) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0);
  *pSVar7 = (1.0 - dVar2) * (1.0 - dVar1) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,1);
  *pSVar7 = (1.0 - dVar2) * (dVar1 + 1.0) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,2);
  *pSVar7 = (dVar1 + 1.0) * (1.0 - dVar2) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,3);
  *pSVar7 = (1.0 - dVar1) * (1.0 - dVar2) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,4);
  *pSVar7 = (dVar2 + 1.0) * (1.0 - dVar1) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,5);
  *pSVar7 = (dVar2 + 1.0) * (dVar1 + 1.0) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,6);
  *pSVar7 = (dVar1 + 1.0) * (dVar2 + 1.0) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,7);
  *pSVar7 = (1.0 - dVar1) * (dVar2 + 1.0) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0);
  *pSVar7 = (1.0 - dVar2) * (1.0 - dVar1) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,1);
  *pSVar7 = (1.0 - dVar2) * (dVar1 + 1.0) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,2);
  *pSVar7 = (dVar2 + 1.0) * (dVar1 + 1.0) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,3);
  *pSVar7 = (dVar2 + 1.0) * (1.0 - dVar1) * -0.125;
  auVar3 = *(undefined1 (*) [16])coord->m_data;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,4);
  auVar8 = vsubpd_avx(local_38,auVar3);
  auVar3 = vshufpd_avx(auVar8,auVar8,1);
  *pSVar7 = auVar8._0_8_ * auVar3._0_8_ * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,5);
  *pSVar7 = (dVar1 + 1.0) * (1.0 - dVar2) * 0.125;
  auVar3 = *(undefined1 (*) [16])coord->m_data;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,6);
  auVar8._8_8_ = 0x3ff0000000000000;
  auVar8._0_8_ = 0x3ff0000000000000;
  auVar8 = vaddpd_avx512vl(auVar3,auVar8);
  auVar3 = vshufpd_avx(auVar8,auVar8,1);
  *pSVar7 = auVar8._0_8_ * auVar3._0_8_ * 0.125;
  dVar1 = coord->m_data[0];
  auVar3 = *(undefined1 (*) [16])coord->m_data;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,7);
  auVar3 = vshufpd_avx(auVar3,auVar3,1);
  *pSVar7 = (1.0 - dVar1) * (auVar3._0_8_ + 1.0) * 0.125;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,1,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,2,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,3,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,4,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,5,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,6,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar4 = local_70.m_lhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,7,0);
  *pSVar7 = (Scalar)pMVar4;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,1,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,2,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,3,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,4,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,5,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,6,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_rhs;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,7,1);
  *pSVar7 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,1,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,2,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,3,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,4,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,5,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar6 = local_60;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,6,2);
  *pSVar7 = SVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,7,2);
  *pSVar7 = local_60;
  local_70 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)J1,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&J2);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            (Jacobian,&local_70);
  Eigen::internal::handmade_aligned_free
            (J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementHexaCorot_8::ComputeJacobian(ChMatrixDynamic<>& Jacobian, ChMatrixDynamic<>& J1, ChVector<> coord) {
    ChMatrixDynamic<> J2(8, 3);

    J1(0, 0) = -(1 - coord.y()) * (1 - coord.z()) / 8;
    J1(0, 1) = +(1 - coord.y()) * (1 - coord.z()) / 8;
    J1(0, 2) = +(1 + coord.y()) * (1 - coord.z()) / 8;
    J1(0, 3) = -(1 + coord.y()) * (1 - coord.z()) / 8;
    J1(0, 4) = -(1 - coord.y()) * (1 + coord.z()) / 8;
    J1(0, 5) = +(1 - coord.y()) * (1 + coord.z()) / 8;
    J1(0, 6) = +(1 + coord.y()) * (1 + coord.z()) / 8;
    J1(0, 7) = -(1 + coord.y()) * (1 + coord.z()) / 8;

    J1(1, 0) = -(1 - coord.x()) * (1 - coord.z()) / 8;
    J1(1, 1) = -(1 + coord.x()) * (1 - coord.z()) / 8;
    J1(1, 2) = +(1 + coord.x()) * (1 - coord.z()) / 8;
    J1(1, 3) = +(1 - coord.x()) * (1 - coord.z()) / 8;
    J1(1, 4) = -(1 - coord.x()) * (1 + coord.z()) / 8;
    J1(1, 5) = -(1 + coord.x()) * (1 + coord.z()) / 8;
    J1(1, 6) = +(1 + coord.x()) * (1 + coord.z()) / 8;
    J1(1, 7) = +(1 - coord.x()) * (1 + coord.z()) / 8;

    J1(2, 0) = -(1 - coord.x()) * (1 - coord.y()) / 8;
    J1(2, 1) = -(1 + coord.x()) * (1 - coord.y()) / 8;
    J1(2, 2) = -(1 + coord.x()) * (1 + coord.y()) / 8;
    J1(2, 3) = -(1 - coord.x()) * (1 + coord.y()) / 8;
    J1(2, 4) = +(1 - coord.x()) * (1 - coord.y()) / 8;
    J1(2, 5) = +(1 + coord.x()) * (1 - coord.y()) / 8;
    J1(2, 6) = +(1 + coord.x()) * (1 + coord.y()) / 8;
    J1(2, 7) = +(1 - coord.x()) * (1 + coord.y()) / 8;

    J2(0, 0) = nodes[0]->GetX0().x();
    J2(1, 0) = nodes[1]->GetX0().x();
    J2(2, 0) = nodes[2]->GetX0().x();
    J2(3, 0) = nodes[3]->GetX0().x();
    J2(4, 0) = nodes[4]->GetX0().x();
    J2(5, 0) = nodes[5]->GetX0().x();
    J2(6, 0) = nodes[6]->GetX0().x();
    J2(7, 0) = nodes[7]->GetX0().x();

    J2(0, 1) = nodes[0]->GetX0().y();
    J2(1, 1) = nodes[1]->GetX0().y();
    J2(2, 1) = nodes[2]->GetX0().y();
    J2(3, 1) = nodes[3]->GetX0().y();
    J2(4, 1) = nodes[4]->GetX0().y();
    J2(5, 1) = nodes[5]->GetX0().y();
    J2(6, 1) = nodes[6]->GetX0().y();
    J2(7, 1) = nodes[7]->GetX0().y();

    J2(0, 2) = nodes[0]->GetX0().z();
    J2(1, 2) = nodes[1]->GetX0().z();
    J2(2, 2) = nodes[2]->GetX0().z();
    J2(3, 2) = nodes[3]->GetX0().z();
    J2(4, 2) = nodes[4]->GetX0().z();
    J2(5, 2) = nodes[5]->GetX0().z();
    J2(6, 2) = nodes[6]->GetX0().z();
    J2(7, 2) = nodes[7]->GetX0().z();

    Jacobian = J1 * J2;
}